

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

void __thiscall
spvtools::opt::LoopPeeling::DuplicateAndConnectLoop
          (LoopPeeling *this,LoopCloningResult *clone_results)

{
  IRContext *this_00;
  CFG *this_01;
  DefUseManager *pDVar1;
  Function *pFVar2;
  uint32_t *puVar3;
  bool bVar4;
  char cVar5;
  Analysis AVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t succ_blk_id;
  BasicBlock *pBVar9;
  Loop *pLVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar11;
  const_iterator cVar12;
  Instruction *pIVar13;
  IRContext *this_02;
  Instruction *pIVar14;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *pvVar15;
  uint32_t *puVar16;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> UVar17;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ordered_loop_blocks;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  LoopCloningResult *local_80;
  DefUseManager *local_78;
  Instruction *local_70;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> local_68;
  uint32_t *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  this_00 = this->context_;
  AVar6 = this_00->valid_analyses_;
  this_02 = this_00;
  if ((AVar6 & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
    this_02 = this->context_;
    AVar6 = this_02->valid_analyses_;
  }
  this_01 = (this_00->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  if ((AVar6 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_02);
  }
  pDVar1 = (this_02->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  bVar4 = CanPeelLoop(this);
  if (!bVar4) {
    __assert_fail("CanPeelLoop() && \"Cannot peel loop!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x35,
                  "void spvtools::opt::LoopPeeling::DuplicateAndConnectLoop(LoopUtils::LoopCloningResult *)"
                 );
  }
  local_68.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar9 = Loop::GetOrCreatePreHeaderBlock(this->loop_);
  uVar7 = 0;
  Loop::ComputeLoopStructuredOrder(this->loop_,&local_68,false,false);
  local_80 = clone_results;
  pLVar10 = LoopUtils::CloneLoop(&this->loop_utils_,clone_results,&local_68);
  this->cloned_loop_ = pLVar10;
  pFVar2 = (this->loop_utils_).function_;
  pIVar13 = (pBVar9->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar13->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
  }
  UVar17 = std::
           __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                     (&pFVar2->blocks_,
                      (pFVar2->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,&pFVar2->blocks_,
                      (pFVar2->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,uVar7);
  pFVar2 = (this->loop_utils_).function_;
  pvVar15 = &pFVar2->blocks_;
  if ((UVar17.container_ == pvVar15) &&
     (UVar17.iterator_._M_current._M_current ==
      (pFVar2->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    __assert_fail("it != loop_utils_.GetFunction()->end() && \"Pre-header not found in the function.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x43,
                  "void spvtools::opt::LoopPeeling::DuplicateAndConnectLoop(LoopUtils::LoopCloningResult *)"
                 );
  }
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
  ::
  _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>>>
            ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
              *)pvVar15,UVar17.iterator_._M_current._M_current + 1,
             (local_80->cloned_bb_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (local_80->cloned_bb_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_a0._M_unused._M_object = this->cloned_loop_->loop_header_;
  local_a0._8_8_ = 0;
  local_88 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:74:7)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:74:7)>
             ::_M_manager;
  BasicBlock::ForEachSuccessorLabel(pBVar9,(function<void_(unsigned_int_*)> *)&local_a0);
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  pIVar13 = (pBVar9->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar8 = 0;
  uVar7 = 0;
  if (pIVar13->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
  }
  pIVar13 = (this->loop_->loop_header_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar13->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
  }
  local_78 = pDVar1;
  CFG::RemoveEdge(this_01,uVar7,uVar8);
  Loop::SetPreHeaderBlock(this->cloned_loop_,pBVar9);
  uVar8 = 0;
  Loop::SetPreHeaderBlock(this->loop_,(BasicBlock *)0x0);
  pIVar13 = (this->loop_->loop_merge_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar7 = 0;
  if (pIVar13->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
  }
  pvVar11 = CFG::preds(this_01,uVar7);
  puVar16 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar16 != puVar3) {
    uVar8 = 0;
    do {
      uVar7 = *puVar16;
      local_a0._0_4_ = uVar7;
      cVar12 = std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&(this->loop_->loop_basic_blocks_)._M_h,
                      (key_type_conflict *)local_a0._M_pod_data);
      if (cVar12.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        pBVar9 = CFG::block(this_01,uVar7);
        if (uVar8 != 0) {
          __assert_fail("cloned_loop_exit == 0 && \"The loop has multiple exits.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                        ,0x5a,
                        "void spvtools::opt::LoopPeeling::DuplicateAndConnectLoop(LoopUtils::LoopCloningResult *)"
                       );
        }
        pIVar13 = (pBVar9->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar8 = 0;
        if (pIVar13->has_result_id_ == true) {
          uVar8 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
        }
        local_a0._8_8_ = 0;
        local_88 = std::
                   _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:92:31)>
                   ::_M_invoke;
        local_90 = std::
                   _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:92:31)>
                   ::_M_manager;
        local_a0._M_unused._M_object = this;
        BasicBlock::ForEachSuccessorLabel(pBVar9,(function<void_(unsigned_int_*)> *)&local_a0);
        if (local_90 != (code *)0x0) {
          (*local_90)(&local_a0,&local_a0,__destroy_functor);
        }
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar3);
  }
  pIVar13 = (this->loop_->loop_merge_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  succ_blk_id = 0;
  uVar7 = 0;
  if (pIVar13->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
  }
  CFG::RemoveNonExistingEdges(this_01,uVar7);
  pIVar13 = (this->loop_->loop_header_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar13->has_result_id_ == true) {
    succ_blk_id = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
  }
  CFG::AddEdge(this_01,uVar8,succ_blk_id);
  pBVar9 = this->loop_->loop_header_;
  local_48 = 0;
  local_50 = (uint32_t *)operator_new(0x20);
  *local_50 = uVar8;
  *(DefUseManager **)(local_50 + 2) = local_78;
  *(LoopCloningResult **)(local_50 + 4) = local_80;
  *(LoopPeeling **)(local_50 + 6) = this;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:132:43)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:132:43)>
             ::_M_manager;
  local_a0._8_8_ = 0;
  local_88 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_manager;
  pIVar13 = (pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_a0._M_unused._M_object = &local_50;
  if ((pIVar13 != (Instruction *)0x0) &&
     ((pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar13 == (Instruction *)0x0) break;
      pIVar14 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar14->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar14 = (Instruction *)0x0;
      }
      if (pIVar13->opcode_ != OpPhi) break;
      local_70 = pIVar13;
      if (local_90 == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      cVar5 = (*local_88)(&local_a0,(uint **)&local_70);
      pIVar13 = pIVar14;
    } while (cVar5 != '\0');
    if (local_90 == (code *)0x0) goto LAB_0024759d;
  }
  (*local_90)(&local_a0,&local_a0,__destroy_functor);
LAB_0024759d:
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  pLVar10 = this->cloned_loop_;
  pBVar9 = Loop::GetOrCreatePreHeaderBlock(this->loop_);
  Loop::SetMergeBlock(pLVar10,pBVar9);
  if (local_68.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LoopPeeling::DuplicateAndConnectLoop(
    LoopUtils::LoopCloningResult* clone_results) {
  CFG& cfg = *context_->cfg();
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  assert(CanPeelLoop() && "Cannot peel loop!");

  std::vector<BasicBlock*> ordered_loop_blocks;
  // TODO(1841): Handle failure to create pre-header.
  BasicBlock* pre_header = loop_->GetOrCreatePreHeaderBlock();

  loop_->ComputeLoopStructuredOrder(&ordered_loop_blocks);

  cloned_loop_ = loop_utils_.CloneLoop(clone_results, ordered_loop_blocks);

  // Add the basic block to the function.
  Function::iterator it =
      loop_utils_.GetFunction()->FindBlock(pre_header->id());
  assert(it != loop_utils_.GetFunction()->end() &&
         "Pre-header not found in the function.");
  loop_utils_.GetFunction()->AddBasicBlocks(
      clone_results->cloned_bb_.begin(), clone_results->cloned_bb_.end(), ++it);

  // Make the |loop_|'s preheader the |cloned_loop_| one.
  BasicBlock* cloned_header = cloned_loop_->GetHeaderBlock();
  pre_header->ForEachSuccessorLabel(
      [cloned_header](uint32_t* succ) { *succ = cloned_header->id(); });

  // Update cfg.
  cfg.RemoveEdge(pre_header->id(), loop_->GetHeaderBlock()->id());
  cloned_loop_->SetPreHeaderBlock(pre_header);
  loop_->SetPreHeaderBlock(nullptr);

  // When cloning the loop, we didn't cloned the merge block, so currently
  // |cloned_loop_| shares the same block as |loop_|.
  // We mutate all branches from |cloned_loop_| block to |loop_|'s merge into a
  // branch to |loop_|'s header (so header will also be the merge of
  // |cloned_loop_|).
  uint32_t cloned_loop_exit = 0;
  for (uint32_t pred_id : cfg.preds(loop_->GetMergeBlock()->id())) {
    if (loop_->IsInsideLoop(pred_id)) continue;
    BasicBlock* bb = cfg.block(pred_id);
    assert(cloned_loop_exit == 0 && "The loop has multiple exits.");
    cloned_loop_exit = bb->id();
    bb->ForEachSuccessorLabel([this](uint32_t* succ) {
      if (*succ == loop_->GetMergeBlock()->id())
        *succ = loop_->GetHeaderBlock()->id();
    });
  }

  // Update cfg.
  cfg.RemoveNonExistingEdges(loop_->GetMergeBlock()->id());
  cfg.AddEdge(cloned_loop_exit, loop_->GetHeaderBlock()->id());

  // Patch the phi of the original loop header:
  //  - Set the loop entry branch to come from the cloned loop exit block;
  //  - Set the initial value of the phi using the corresponding cloned loop
  //    exit values.
  //
  // We patch the iterating value initializers of the original loop using the
  // corresponding cloned loop exit values. Connects the cloned loop iterating
  // values to the original loop. This make sure that the initial value of the
  // second loop starts with the last value of the first loop.
  //
  // For example, loops like:
  //
  // int z = 0;
  // for (int i = 0; i++ < M; i += cst1) {
  //   if (cond)
  //     z += cst2;
  // }
  //
  // Will become:
  //
  // int z = 0;
  // int i = 0;
  // for (; i++ < M; i += cst1) {
  //   if (cond)
  //     z += cst2;
  // }
  // for (; i++ < M; i += cst1) {
  //   if (cond)
  //     z += cst2;
  // }
  loop_->GetHeaderBlock()->ForEachPhiInst([cloned_loop_exit, def_use_mgr,
                                           clone_results,
                                           this](Instruction* phi) {
    for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
      if (!loop_->IsInsideLoop(phi->GetSingleWordInOperand(i + 1))) {
        phi->SetInOperand(i,
                          {clone_results->value_map_.at(
                              exit_value_.at(phi->result_id())->result_id())});
        phi->SetInOperand(i + 1, {cloned_loop_exit});
        def_use_mgr->AnalyzeInstUse(phi);
        return;
      }
    }
  });

  // Force the creation of a new preheader for the original loop and set it as
  // the merge block for the cloned loop.
  // TODO(1841): Handle failure to create pre-header.
  cloned_loop_->SetMergeBlock(loop_->GetOrCreatePreHeaderBlock());
}